

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  Vector::zero(x);
  puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = puVar1;
  if (puVar1 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar2);
      puVar2 = puVar2 + 1;
    } while (puVar2 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish);
    puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  }
  lVar3 = (long)puVar2 - (long)puVar1 >> 2;
  auVar4._8_4_ = (int)((long)puVar2 - (long)puVar1 >> 0x22);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  Vector::mul(x,(float)(1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))));
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}